

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_ssl_addsessionid(connectdata *conn,void *ssl_sessionid,size_t idsize,int sockindex)

{
  uint uVar1;
  Curl_easy *pCVar2;
  Curl_share *pCVar3;
  ulong uVar4;
  curl_ssl_session *pcVar5;
  long lVar6;
  _Bool _Var7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  curl_ssl_session *session;
  long *plVar15;
  long lVar16;
  long lVar17;
  
  pCVar2 = conn->data;
  session = (pCVar2->state).session;
  if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
    _Var7 = (conn->bits).proxy_ssl_connected[sockindex];
    lVar17 = 0x5c8;
    if (_Var7 != false) {
      lVar17 = 0x570;
    }
    lVar9 = 0x3d0;
    if (_Var7 != false) {
      lVar9 = 0x340;
    }
    bVar13 = _Var7 ^ 1;
  }
  else {
    lVar9 = 0x340;
    lVar17 = 0x570;
    bVar13 = 0;
  }
  lVar16 = session->age;
  pcVar10 = (*Curl_cstrdup)(*(char **)((conn->cnnct).socksreq + lVar9 + -0xc));
  if (pcVar10 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((uVar1 & 8) == 0) {
    pcVar11 = (char *)0x0;
  }
  else {
    pcVar11 = (*Curl_cstrdup)((conn->conn_to_host).name);
    if (pcVar11 == (char *)0x0) {
      (*Curl_cfree)(pcVar10);
      return CURLE_OUT_OF_MEMORY;
    }
    uVar1 = *(uint *)&(conn->bits).field_0x4;
  }
  if ((uVar1 & 0x10) == 0) {
    iVar8 = -1;
  }
  else {
    iVar8 = conn->conn_to_port;
  }
  pCVar3 = pCVar2->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
    plVar15 = &(pCVar2->state).sessionage;
  }
  else {
    plVar15 = &pCVar3->sessionage;
  }
  uVar4 = (pCVar2->set).general_ssl.max_ssl_sessions;
  uVar14 = 1;
  for (lVar9 = 0x90;
      (uVar12 = uVar4 + (uVar4 == 0), uVar14 < uVar4 &&
      (pcVar5 = (pCVar2->state).session, uVar12 = uVar14,
      *(long *)((long)&pcVar5->sessionid + lVar9) != 0)); lVar9 = lVar9 + 0x90) {
    lVar6 = *(long *)((long)&pcVar5->age + lVar9);
    if (lVar6 < lVar16) {
      session = (curl_ssl_session *)((long)&pcVar5->name + lVar9);
      lVar16 = lVar6;
    }
    uVar14 = uVar14 + 1;
  }
  if (uVar12 == uVar4) {
    Curl_ssl_kill_session(session);
  }
  else {
    session = (pCVar2->state).session + uVar12;
  }
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar15;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar10;
  session->conn_to_host = pcVar11;
  session->conn_to_port = iVar8;
  if (bVar13 == 0) {
    iVar8 = conn->remote_port;
  }
  else {
    iVar8 = (int)conn->port;
  }
  session->remote_port = iVar8;
  session->scheme = conn->handler->scheme;
  _Var7 = Curl_clone_primary_ssl_config
                    ((ssl_primary_config *)((conn->cnnct).socksreq + lVar17 + -0xc),
                     &session->ssl_config);
  if (!_Var7) {
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar10);
    (*Curl_cfree)(pcVar11);
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct connectdata *conn,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_easy *data = conn->data; /* the mother of all structs */
  struct curl_ssl_session *store = &data->state.session[0];
  long oldest_age = data->state.session[0].age; /* zero if unused */
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
  const bool isProxy = CONNECT_PROXY_SSL();
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;

  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(isProxy ? conn->http_proxy.host.name : conn->host.name);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  return CURLE_OK;
}